

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alg.cpp
# Opt level: O0

double __thiscall
Alg::opimb_fast_end(Alg *this,Graph *graph,double budget,
                   vector<double,_std::allocator<double>_> *budget_list,double epsilon,double feps,
                   double delta,string *model,string *graphname,int mode)

{
  ResultInfo *this_00;
  int iVar1;
  undefined8 *puVar2;
  ostream *poVar3;
  size_t sVar4;
  size_type sVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  string local_510;
  string local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  char *local_390;
  char *dt;
  time_t now;
  double approxOPIMC;
  double upperOPT;
  double lowerSelect;
  double upperDegOPT;
  double upperBound_med;
  double upperBound;
  double degVldt;
  double infVldt;
  double infSelf;
  size_t numR;
  size_t idx;
  double dStack_320;
  int satisfy_count;
  double timeb;
  double time2;
  double time1;
  double a2;
  double a1;
  size_t numIter;
  size_t theta_max;
  size_t theta_zero;
  int local_2c4;
  undefined1 local_2c0 [4];
  int k_min;
  int local_2a4;
  double dStack_2a0;
  int k_max;
  double alpha;
  double approx;
  double local_280;
  double e_alpha;
  ofstream outfile;
  undefined1 local_78 [8];
  Timer timerOPIMC;
  int mode_local;
  string *graphname_local;
  string *model_local;
  double delta_local;
  double feps_local;
  double epsilon_local;
  vector<double,_std::allocator<double>_> *budget_list_local;
  double budget_local;
  Graph *graph_local;
  Alg *this_local;
  
  timerOPIMC.__processName._4_4_ = mode;
  Timer::Timer((Timer *)local_78,"OPIM-B-FAST-END");
  std::ofstream::ofstream(&e_alpha);
  if (1e-06 < ABS(feps - 0.01)) {
    if (1e-06 < ABS(feps - 0.05)) {
      if (1e-06 < ABS(feps - 0.1)) {
        if (1e-06 < ABS(feps - 0.15)) {
          if (1e-06 < ABS(feps - 0.2)) {
            puVar2 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar2 = "feps error!";
            __cxa_throw(puVar2,&char_const*::typeinfo,0);
          }
          local_280 = exp((1.0 - feps) * 0.427369);
        }
        else {
          local_280 = exp((1.0 - feps) * 0.430099);
        }
      }
      else {
        local_280 = exp((1.0 - feps) * 0.432857);
      }
    }
    else {
      local_280 = exp((1.0 - feps) * 0.435641);
    }
  }
  else {
    local_280 = exp((1.0 - feps) * 0.437888);
  }
  alpha = 1.0 - 1.0 / local_280;
  poVar3 = std::operator<<((ostream *)&std::cout,"Approx: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,alpha);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  dVar7 = log(6.0 / delta);
  dStack_2a0 = sqrt(dVar7);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_2c0,budget_list);
  iVar1 = cal_k_max((vector<double,_std::allocator<double>_> *)local_2c0,budget);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_2c0);
  local_2a4 = iVar1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&theta_zero,budget_list);
  iVar1 = cal_k_min((vector<double,_std::allocator<double>_> *)&theta_zero,budget);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&theta_zero);
  dVar7 = dStack_2a0;
  dVar8 = (double)this->__numV;
  dVar13 = 1.0 - 1.0 / local_280;
  dVar14 = (double)local_2a4;
  local_2c4 = iVar1;
  dVar9 = log(dVar8);
  dVar10 = log(6.0 / delta);
  dVar9 = sqrt(dVar13 * (dVar14 * dVar9 + dVar10));
  dVar9 = pow2(dVar13 * dVar7 + dVar9);
  dVar7 = dStack_2a0;
  dVar8 = ((dVar8 + dVar8) * dVar9) / (double)this->__numV;
  uVar6 = (ulong)dVar8;
  theta_max = uVar6 | (long)(dVar8 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f;
  dVar8 = (double)this->__numV;
  dVar13 = 1.0 - 1.0 / local_280;
  dVar14 = (double)local_2a4;
  dVar9 = log(dVar8);
  dVar10 = log(6.0 / delta);
  dVar9 = sqrt(dVar13 * (dVar14 * dVar9 + dVar10));
  dVar7 = pow2(dVar13 * dVar7 + dVar9);
  dVar9 = pow2(epsilon);
  dVar7 = ((dVar8 + dVar8) * dVar7) / (dVar9 * (double)local_2a4);
  uVar6 = (ulong)dVar7;
  dVar7 = dVar7 - 9.223372036854776e+18;
  numIter = uVar6 | (long)dVar7 & (long)uVar6 >> 0x3f;
  dVar7 = log2(dVar7);
  a1 = (double)(((long)dVar7 | (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f) + 1);
  auVar11._8_4_ = (int)((ulong)a1 >> 0x20);
  auVar11._0_8_ = a1;
  auVar11._12_4_ = 0x45300000;
  a2 = log((((auVar11._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(a1,0)) - 4503599627370496.0)) * 3.0) / delta);
  auVar12._8_4_ = (int)((ulong)a1 >> 0x20);
  auVar12._0_8_ = a1;
  auVar12._12_4_ = 0x45300000;
  time1 = log((((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,SUB84(a1,0)) - 4503599627370496.0)) * 3.0) / delta);
  time2 = 0.0;
  timeb = 0.0;
  dStack_320 = 0.0;
  idx._4_4_ = 0;
  numR = 0;
  while( true ) {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,numR);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    infSelf = (double)(theta_max << ((byte)numR & 0x3f));
    Timer::get_operation_time((Timer *)local_78);
    HyperGraph::build_n_RRsets(&this->__hyperG,(size_t)infSelf);
    HyperGraph::build_n_RRsets(&this->__hyperGVldt,(size_t)infSelf);
    poVar3 = std::operator<<((ostream *)&std::cout,"# RR sets: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)infSelf);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    sVar4 = HyperGraph::get_RR_sets_size(&this->__hyperG);
    this->__numRRsets = sVar4;
    dVar7 = Timer::get_operation_time((Timer *)local_78);
    time2 = time2 + dVar7;
    infVldt = max_cover_budget_fast_end
                        (this,graph,budget,budget_list,feps,&stack0xfffffffffffffce0,
                         timerOPIMC.__processName._4_4_);
    dVar7 = Timer::get_operation_time((Timer *)local_78);
    timeb = timeb + dVar7;
    degVldt = HyperGraph::self_inf_cal(&this->__hyperGVldt,&this->__vecSeed);
    sVar4 = this->__numRRsets;
    auVar15._8_4_ = (int)(sVar4 >> 0x20);
    auVar15._0_8_ = sVar4;
    auVar15._12_4_ = 0x45300000;
    upperBound = (degVldt *
                 ((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0))) /
                 (double)this->__numV;
    upperBound_med = infVldt;
    upperDegOPT = infVldt / alpha;
    if (timerOPIMC.__processName._4_4_ == 1) {
      if ((this->__is_inf_cost & 1U) == 0) {
        upperBound_med = this->__boundMin_inf;
      }
      else {
        upperBound_med = this->__boundMin_inf_cost;
        upperBound_med = min_bound(upperBound_med,upperDegOPT);
      }
    }
    else if (timerOPIMC.__processName._4_4_ == 2) {
      if ((this->__is_inf_cost & 1U) == 0) {
        upperBound_med = this->__boundMin_inf;
      }
      else {
        upperBound_med = this->__boundMin_inf_cost;
        upperBound_med = min_bound(upperBound_med,upperDegOPT);
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"========upper bound ratio: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,upperBound_med / upperDegOPT);
    poVar3 = std::operator<<(poVar3,"========");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    sVar4 = this->__numRRsets;
    auVar16._8_4_ = (int)(sVar4 >> 0x20);
    auVar16._0_8_ = sVar4;
    auVar16._12_4_ = 0x45300000;
    lowerSelect = (upperBound_med *
                  ((auVar16._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0))) /
                  (double)this->__numV;
    dVar7 = sqrt(upperBound + (a2 + a2) / 9.0);
    dVar8 = sqrt(a2 * 0.5);
    dVar7 = pow2(dVar7 - dVar8);
    upperOPT = dVar7 - a2 / 18.0;
    if (upperOPT < 0.0) {
      upperOPT = 0.0;
    }
    dVar7 = sqrt(lowerSelect + time1 * 0.5);
    dVar8 = sqrt(time1 * 0.5);
    approxOPIMC = pow2(dVar7 + dVar8);
    now = (time_t)(upperOPT / approxOPIMC);
    poVar3 = std::operator<<((ostream *)&std::cout," -->OPIM-B-FAST-END (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,numR + 1);
    poVar3 = std::operator<<(poVar3,"/");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)a1);
    poVar3 = std::operator<<(poVar3,") approx. (max-cover): ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)now);
    poVar3 = std::operator<<(poVar3," (");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,infVldt / upperBound_med);
    poVar3 = std::operator<<(poVar3,"), #RR sets: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->__numRRsets);
    std::operator<<(poVar3,'\n');
    if ((alpha - epsilon <= (double)now) && (idx._4_4_ == 1)) break;
    if ((alpha - epsilon <= (double)now) && (idx._4_4_ == 0)) {
      idx._4_4_ = 1;
    }
    numR = numR + 1;
  }
  ResultInfo::set_approximation(this->__tRes,(double)now);
  this_00 = this->__tRes;
  dVar7 = Timer::get_total_time((Timer *)local_78);
  ResultInfo::set_running_time(this_00,dVar7);
  ResultInfo::set_influence(this->__tRes,degVldt);
  ResultInfo::set_influence_original(this->__tRes,infVldt);
  ResultInfo::set_seed_vec(this->__tRes,&this->__vecSeed);
  ResultInfo::set_seed_inf_vec(this->__tRes,&this->__vecSeed_inf);
  ResultInfo::set_seed_inf_cost_vec(this->__tRes,&this->__vecSeed_inf_cost);
  ResultInfo::set_boundmin_inf(this->__tRes,this->__boundMin_inf);
  ResultInfo::set_boundmin_inf_cost(this->__tRes,this->__boundMin_inf_cost);
  ResultInfo::set_RR_sets_size(this->__tRes,this->__numRRsets * 2);
  poVar3 = std::operator<<((ostream *)&std::cout,"==>Influence via R2: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,degVldt);
  poVar3 = std::operator<<(poVar3,", time: ");
  dVar7 = ResultInfo::get_running_time(this->__tRes);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar7);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"==>Time for RR sets and greedy: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,time2);
  poVar3 = std::operator<<(poVar3,", ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,timeb - dStack_320);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"==>Time for Bound Computation: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dStack_320);
  std::operator<<(poVar3,'\n');
  poVar3 = std::operator<<((ostream *)&std::cout,"Seed size: ");
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  dt = (char *)time((time_t *)0x0);
  local_390 = ctime((time_t *)&dt);
  std::operator+(&local_4d0,"fast/",model);
  std::operator+(&local_4b0,&local_4d0,"_");
  std::operator+(&local_490,&local_4b0,graphname);
  std::operator+(&local_470,&local_490,"_");
  std::__cxx11::to_string(&local_4f0,epsilon);
  std::operator+(&local_450,&local_470,&local_4f0);
  std::operator+(&local_430,&local_450,"_");
  std::__cxx11::to_string(&local_510,feps);
  std::operator+(&local_410,&local_430,&local_510);
  std::operator+(&local_3f0,&local_410,"_");
  std::operator+(&local_3d0,&local_3f0,local_390);
  std::operator+(&local_3b0,&local_3d0,".txt");
  std::ofstream::open((string *)&e_alpha,(_Ios_Openmode)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  dVar7 = ResultInfo::get_running_time(this->__tRes);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&e_alpha,dVar7);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->__numRRsets * 2);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,degVldt);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,infVldt);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::operator<<(poVar3,",");
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->__vecSeed);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar5);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(double)now);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,time2);
  poVar3 = std::operator<<(poVar3,",");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dStack_320);
  poVar3 = std::operator<<(poVar3,",");
  std::ostream::operator<<(poVar3,timeb - dStack_320);
  std::ofstream::~ofstream(&e_alpha);
  return 0.0;
}

Assistant:

double Alg::opimb_fast_end(const Graph & graph, const double budget, const std::vector<double> & budget_list,
        const double epsilon, const double feps, const double delta, const std::string model,
        std::string graphname, const int mode) {
    Timer timerOPIMC("OPIM-B-FAST-END");
    std::ofstream outfile;
    double e_alpha;
    if (fabs(feps - 0.01) <= 0.000001) {
        e_alpha = exp(0.437888 * (1 - feps));
    }
    else if (fabs(feps - 0.05) <= 0.000001) {
        e_alpha = exp(0.435641 * (1 - feps));
    }
    else if (fabs(feps - 0.1) <= 0.000001) {
        e_alpha = exp(0.432857 * (1 - feps));
    }
    else if (fabs(feps - 0.15) <= 0.000001) {
        e_alpha = exp(0.430099 * (1 - feps));
    }
    else if (fabs(feps - 0.2) <= 0.000001) {
        e_alpha = exp(0.427369 * (1 - feps));
    }
    else {
        throw "feps error!";
    }
    const double approx = 1 - 1.0 / e_alpha;
    std::cout << "Approx: " << approx << std::endl;
    const double alpha = sqrt(log(6.0 / delta));
    const int k_max = cal_k_max(budget_list, budget);
    const int k_min = cal_k_min(budget_list, budget);
    const auto theta_zero = (size_t) ((2.0 * __numV * pow2((1 - 1 / e_alpha) * alpha
            + sqrt((1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (__numV));
    const auto theta_max = (size_t) ((2.0 * __numV * pow2((1 - 1 / e_alpha) * alpha
            + sqrt((1 - 1 / e_alpha) * (k_max * log(__numV) + log(6.0 / delta))))) / (pow2(epsilon) * k_max));
    const auto numIter = (size_t) log2(theta_max / theta_zero) + 1;
    const double a1 = log(numIter * 3.0 / delta);
    const double a2 = log(numIter * 3.0 / delta);
    double time1 = 0.0, time2 = 0.0;
    double timeb = 0.0;
    int satisfy_count = 0;
    size_t idx = 0;
    while (true) {
        std::cout << idx << std::endl;
        const auto numR = theta_zero << idx;
        timerOPIMC.get_operation_time();
        __hyperG.build_n_RRsets(numR); // R1
        __hyperGVldt.build_n_RRsets(numR); // R2
        std::cout << "# RR sets: " << numR << std::endl;
        __numRRsets = __hyperG.get_RR_sets_size();
        time1 += timerOPIMC.get_operation_time();
        const auto infSelf = max_cover_budget_fast_end(graph, budget, budget_list, feps, timeb, mode);
        time2 += timerOPIMC.get_operation_time();
        const auto infVldt = __hyperGVldt.self_inf_cal(__vecSeed);
        const auto degVldt = infVldt * __numRRsets / __numV;
        auto upperBound = infSelf;
        auto upperBound_med = infSelf / approx;
        if (mode == 1) {
//            upperBound = max_element(__boundLast_inf, __boundLast_inf_cost);
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        else if (mode == 2) {
            if (__is_inf_cost) {
                upperBound = __boundMin_inf_cost;
                upperBound = min_bound(upperBound, upperBound_med);
            }
            else {
                upperBound = __boundMin_inf;
            }
        }
        std::cout << "========upper bound ratio: " << upperBound / upperBound_med << "========" << std::endl;
        const auto upperDegOPT = upperBound * __numRRsets / __numV;
        auto lowerSelect = pow2(sqrt(degVldt + a1 * 2.0 / 9.0) - sqrt(a1 / 2.0)) - a1 / 18.0;
        if (lowerSelect < 0) {
            lowerSelect = 0;
        }
        const auto upperOPT = pow2(sqrt(upperDegOPT + a2 / 2.0) + sqrt(a2 / 2.0));
        const auto approxOPIMC = lowerSelect / upperOPT;
        std::cout << " -->OPIM-B-FAST-END (" << idx + 1 << "/" << numIter << ") approx. (max-cover): " <<
            approxOPIMC << " (" << infSelf / upperBound << "), #RR sets: " << __numRRsets << '\n';
        // Check whether the requirement is satisfied
        if (approxOPIMC >= approx - epsilon && satisfy_count == 1)
        {
            __tRes.set_approximation(approxOPIMC);
            __tRes.set_running_time(timerOPIMC.get_total_time());
            __tRes.set_influence(infVldt);
            __tRes.set_influence_original(infSelf);
            __tRes.set_seed_vec(__vecSeed);
            __tRes.set_seed_inf_vec(__vecSeed_inf);
            __tRes.set_seed_inf_cost_vec(__vecSeed_inf_cost);
            __tRes.set_boundmin_inf(__boundMin_inf);
            __tRes.set_boundmin_inf_cost(__boundMin_inf_cost);
            __tRes.set_RR_sets_size(__numRRsets * 2);
            std::cout << "==>Influence via R2: " << infVldt << ", time: " << __tRes.get_running_time() << '\n';
            std::cout << "==>Time for RR sets and greedy: " << time1 << ", " << time2 - timeb << '\n';
            std::cout << "==>Time for Bound Computation: " << timeb << '\n';
            std::cout << "Seed size: " << __vecSeed.size() << std::endl;
            time_t now = time(0);
            char* dt = ctime(&now);
            outfile.open("fast/" + model + "_" + graphname + "_" + std::to_string(epsilon) + "_" + std::to_string(feps)
                         + "_" + dt + ".txt");
            outfile << __tRes.get_running_time() << "," << "," << __numRRsets * 2 << "," <<
            infVldt << "," << "," << infSelf << "," << "," << __vecSeed.size() << "," <<
            approxOPIMC << "," << "," << time1 << "," << timeb << "," << time2 - timeb;
            return 0;
        }
        else if (approxOPIMC >= approx - epsilon && satisfy_count == 0) {
            satisfy_count = satisfy_count + 1;
        }
        idx = idx + 1;
    }
}